

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fFunctionalTests.cpp
# Opt level: O3

int __thiscall
deqp::gles2::Functional::StateQueryTests::init(StateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  BooleanStateQueryTests *this_00;
  IntegerStateQueryTests *this_01;
  FloatStateQueryTests *this_02;
  TextureStateQueryTests *this_03;
  TestNode *pTVar1;
  BufferObjectQueryTests *this_04;
  
  this_00 = (BooleanStateQueryTests *)operator_new(0x98);
  BooleanStateQueryTests::BooleanStateQueryTests(this_00,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (IntegerStateQueryTests *)operator_new(0x90);
  IntegerStateQueryTests::IntegerStateQueryTests(this_01,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  this_02 = (FloatStateQueryTests *)operator_new(0x90);
  FloatStateQueryTests::FloatStateQueryTests(this_02,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_02);
  this_03 = (TextureStateQueryTests *)operator_new(0x88);
  TextureStateQueryTests::TextureStateQueryTests(this_03,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_03);
  pTVar1 = (TestNode *)operator_new(0x78);
  StringQueryTests::StringQueryTests
            ((StringQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_04 = (BufferObjectQueryTests *)operator_new(0x80);
  BufferObjectQueryTests::BufferObjectQueryTests(this_04,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_04);
  pTVar1 = (TestNode *)operator_new(0x78);
  FboStateQueryTests::FboStateQueryTests
            ((FboStateQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RboStateQueryTests::RboStateQueryTests
            ((RboStateQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ShaderStateQueryTests::ShaderStateQueryTests
            ((ShaderStateQueryTests *)pTVar1,(this->super_TestCaseGroup).m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void init (void)
	{
		addChild(new BooleanStateQueryTests		(m_context));
		addChild(new IntegerStateQueryTests		(m_context));
		addChild(new FloatStateQueryTests		(m_context));
		addChild(new TextureStateQueryTests		(m_context));
		addChild(new StringQueryTests			(m_context));
		addChild(new BufferObjectQueryTests		(m_context));
		addChild(new FboStateQueryTests			(m_context));
		addChild(new RboStateQueryTests			(m_context));
		addChild(new ShaderStateQueryTests		(m_context));
	}